

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

int list_size_aux(List *ls,int level)

{
  int iVar1;
  int level_00;
  int iVar2;
  
  if (level < 0x3e9) {
    level_00 = level + 1;
    iVar2 = 0;
    do {
      if (ls == (List *)0x0) {
        return iVar2;
      }
      iVar1 = list_size_aux(ls->car,level_00);
      ls = ls->cdr;
      iVar2 = iVar2 + iVar1 + 1;
      level_00 = level_00 + 1;
    } while (level_00 != 0x3ea);
  }
  abort();
}

Assistant:

static int
list_size_aux (const List *ls, int level)
{
  if (level > 1000)  /* avoid infinite death */
    abort ();
  if (ls == NULL)  /* Recursion base case. */
    return 0;
  return (1 + list_size_aux (ls->car, level + 1)
	  + list_size_aux (ls->cdr, level + 1));
}